

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O3

ssize_t __thiscall
libtorrent::aux::posix_part_file::write(posix_part_file *this,int __fd,void *__buf,size_t __n)

{
  slot_index_t sVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  void *pvVar4;
  int *piVar5;
  undefined4 in_register_00000034;
  int in_R8D;
  int *in_R9;
  file_pointer f;
  key_type local_3c;
  _Alloc_hider local_38;
  
  iVar2 = (int)__n;
  local_3c.m_val = iVar2;
  open_file((posix_part_file *)&stack0xffffffffffffffc8,(open_mode)this,(error_code *)0x1);
  if ((char)in_R9[1] == '\x01') {
    __buf = (void *)0xffffffff;
  }
  else {
    p_Var3 = ::std::
             _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_piece_map)._M_h,
                        (ulong)(long)iVar2 % (this->m_piece_map)._M_h._M_bucket_count,&local_3c,
                        (long)iVar2);
    if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
      sVar1 = allocate_slot(this,local_3c.m_val);
    }
    else {
      sVar1.m_val = *(int *)((long)&p_Var3->_M_nxt[1]._M_nxt + 4);
    }
    iVar2 = fseeko64((FILE *)local_38._M_p,
                     (long)in_R8D + (long)this->m_header_size +
                     (long)this->m_piece_size * (long)sVar1.m_val,0);
    if (iVar2 == 0) {
      pvVar4 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,
                              (FILE *)local_38._M_p);
      if (pvVar4 == __buf) goto LAB_00294d30;
    }
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    *in_R9 = iVar2;
    *(bool *)(in_R9 + 1) = iVar2 != 0;
    *(generic_error_category **)(in_R9 + 2) =
         &boost::system::detail::cat_holder<void>::generic_category_instance;
    __buf = (void *)0xffffffff;
  }
LAB_00294d30:
  if ((FILE *)local_38._M_p != (FILE *)0x0) {
    fclose((FILE *)local_38._M_p);
  }
  return (ulong)__buf & 0xffffffff;
}

Assistant:

int posix_part_file::write(span<char const> buf, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);

		auto f = open_file(open_mode::read_write, ec);
		if (ec) return -1;

		auto const i = m_piece_map.find(piece);
		slot_index_t const slot = (i == m_piece_map.end())
			? allocate_slot(piece) : i->second;

		if (portable_fseeko(f.file(), slot_offset(slot) + offset, SEEK_SET) != 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		auto const written = std::fwrite(buf.data(), 1, std::size_t(buf.size()), f.file());
		if (written != std::size_t(buf.size()))
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		return int(written);
	}